

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_validateTest_Test::TestBody(OpenDDLParserTest_validateTest_Test *this)

{
  bool bVar1;
  FILE *__stream;
  reference __ptr;
  char *pcVar2;
  size_t len;
  char *in_R9;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__2;
  char token [62];
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_a0 [7];
  bool result;
  vector<char,_std::allocator<char>_> buffer;
  size_t size;
  FILE *fileStream;
  OpenDDLParser parser;
  OpenDDLParserTest_validateTest_Test *this_local;
  
  parser.m_context = (Context *)this;
  OpenDDLParser::OpenDDLParser((OpenDDLParser *)&fileStream);
  __stream = fopen("/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/TestData/clusterfuzz-testcase-minimized-assimp_fuzzer-5699047558742016"
                   ,"rb");
  fseek(__stream,0,2);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = _end(__stream);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_a0);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_a0,
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
  __ptr = std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)local_a0,0);
  fread(__ptr,buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,1,__stream);
  fclose(__stream);
  OpenDDLParser::setBuffer
            ((OpenDDLParser *)&fileStream,(vector<char,_std::allocator<char>_> *)local_a0);
  gtest_ar_.message_.ptr_._7_1_ = OpenDDLParser::validate((OpenDDLParser *)&fileStream);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_b8,(bool)(~gtest_ar_.message_.ptr_._7_1_ & 1));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b8,(AssertionResult *)"result",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x33f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)local_a0);
  OpenDDLParser::clear((OpenDDLParser *)&fileStream);
  OpenDDLParser::setBuffer
            ((OpenDDLParser *)&fileStream,(vector<char,_std::allocator<char>_> *)local_a0);
  gtest_ar_.message_.ptr_._7_1_ = OpenDDLParser::validate((OpenDDLParser *)&fileStream);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_f8,(bool)gtest_ar_.message_.ptr_._7_1_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(token + 0x38),(internal *)local_f8,(AssertionResult *)"result","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x345,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)(token + 0x38));
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  OpenDDLParser::clear((OpenDDLParser *)&fileStream);
  builtin_strncpy(token + 0x28,"test\"\n    }\n}",0xe);
  builtin_strncpy(token + 0x18,"\n    {\n        \"",0x10);
  builtin_strncpy(token + 8,"de1\n{\n    string",0x10);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x797274656d6f6547;
  builtin_strncpy(token,"Node $no",8);
  len = strlen((char *)&gtest_ar__2.message_);
  OpenDDLParser::setBuffer((OpenDDLParser *)&fileStream,(char *)&gtest_ar__2.message_,len);
  gtest_ar_.message_.ptr_._7_1_ = OpenDDLParser::validate((OpenDDLParser *)&fileStream);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)local_178,(bool)gtest_ar_.message_.ptr_._7_1_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)local_178,(AssertionResult *)"result","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x353,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_a0)
  ;
  OpenDDLParser::~OpenDDLParser((OpenDDLParser *)&fileStream);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, validateTest) {
    OpenDDLParser parser;

    FILE *fileStream = ::fopen(OPENDDL_TEST_DATA "/clusterfuzz-testcase-minimized-assimp_fuzzer-5699047558742016", "rb");
    fseek(fileStream, 0, SEEK_END);
    const size_t size = ::ftell(fileStream);
    std::vector<char> buffer;
    buffer.resize(size);
    ::fread(&buffer[0], size, sizeof(char), fileStream);
    ::fclose(fileStream);

    parser.setBuffer(buffer);
    bool result = parser.validate();
    EXPECT_FALSE(result);

    buffer.clear();
    parser.clear();
    parser.setBuffer(buffer);
    result = parser.validate();
    EXPECT_TRUE(result);

    parser.clear();
    char token[] =
            "GeometryNode $node1\n"
            "{\n"
            "    string\n"
            "    {\n"
            "        \"test\"\n"
            "    }\n"
            "}";

    parser.setBuffer(token, strlen(token));
    result = parser.validate();
    EXPECT_TRUE(result);
}